

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jfdctint.c
# Opt level: O0

void jpeg_fdct_8x4(DCTELEM *data,JSAMPARRAY sample_data,JDIMENSION start_col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  uint in_EDX;
  long in_RSI;
  int *in_RDI;
  int ctr;
  JSAMPROW elemptr;
  DCTELEM *dataptr;
  INT32 z1;
  INT32 tmp13;
  INT32 tmp12;
  INT32 tmp11;
  INT32 tmp10;
  INT32 tmp3;
  INT32 tmp2;
  INT32 tmp1;
  INT32 tmp0;
  int local_74;
  int *local_68;
  
  memset(in_RDI + 0x20,0,0x80);
  local_68 = in_RDI;
  for (local_74 = 0; local_74 < 4; local_74 = local_74 + 1) {
    pbVar4 = (byte *)(*(long *)(in_RSI + (long)local_74 * 8) + (ulong)in_EDX);
    iVar2 = (uint)*pbVar4 + (uint)pbVar4[7] + (uint)pbVar4[3] + (uint)pbVar4[4];
    lVar5 = (long)(int)((uint)*pbVar4 + (uint)pbVar4[7]) -
            (long)(int)((uint)pbVar4[3] + (uint)pbVar4[4]);
    iVar3 = (uint)pbVar4[1] + (uint)pbVar4[6] + (uint)pbVar4[2] + (uint)pbVar4[5];
    lVar6 = (long)(int)((uint)pbVar4[1] + (uint)pbVar4[6]) -
            (long)(int)((uint)pbVar4[2] + (uint)pbVar4[5]);
    lVar7 = (long)(int)((uint)*pbVar4 - (uint)pbVar4[7]);
    lVar8 = (long)(int)((uint)pbVar4[1] - (uint)pbVar4[6]);
    lVar9 = (long)(int)((uint)pbVar4[2] - (uint)pbVar4[5]);
    lVar10 = (long)(int)((uint)pbVar4[3] - (uint)pbVar4[4]);
    *local_68 = (iVar2 + iVar3 + -0x400) * 8;
    local_68[4] = (iVar2 - iVar3) * 8;
    lVar11 = (lVar5 + lVar6) * 0x1151 + 0x200;
    local_68[2] = (int)(lVar11 + lVar5 * 0x187e >> 10);
    local_68[6] = (int)(lVar11 + lVar6 * -0x3b21 >> 10);
    lVar12 = (lVar7 + lVar9 + lVar8 + lVar10) * 0x25a1 + 0x200;
    lVar5 = (lVar7 + lVar10) * -0x1ccd;
    lVar6 = (lVar8 + lVar9) * -0x5203;
    lVar11 = lVar12 + (lVar7 + lVar9) * -0xc7c;
    lVar12 = lVar12 + (lVar8 + lVar10) * -0x3ec5;
    local_68[1] = (int)(lVar7 * 0x300b + lVar5 + lVar11 >> 10);
    local_68[3] = (int)(lVar8 * 0x6254 + lVar6 + lVar12 >> 10);
    local_68[5] = (int)(lVar9 * 0x41b3 + lVar6 + lVar11 >> 10);
    local_68[7] = (int)(lVar10 * 0x98e + lVar5 + lVar12 >> 10);
    local_68 = local_68 + 8;
  }
  local_68 = in_RDI;
  for (local_74 = 7; -1 < local_74; local_74 = local_74 + -1) {
    lVar5 = (long)(*local_68 + local_68[0x18]) + 2;
    iVar2 = *local_68;
    iVar3 = local_68[8];
    iVar1 = local_68[0x10];
    *local_68 = (int)(lVar5 + (local_68[8] + local_68[0x10]) >> 2);
    local_68[0x10] = (int)(lVar5 - (local_68[8] + local_68[0x10]) >> 2);
    lVar5 = ((long)(iVar2 - local_68[0x18]) + (long)(iVar3 - iVar1)) * 0x1151 + 0x4000;
    local_68[8] = (int)(lVar5 + (long)(iVar2 - local_68[0x18]) * 0x187e >> 0xf);
    local_68[0x18] = (int)(lVar5 + (long)(iVar3 - iVar1) * -0x3b21 >> 0xf);
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_fdct_8x4 (DCTELEM * data, JSAMPARRAY sample_data, JDIMENSION start_col)
{
  INT32 tmp0, tmp1, tmp2, tmp3;
  INT32 tmp10, tmp11, tmp12, tmp13;
  INT32 z1;
  DCTELEM *dataptr;
  JSAMPROW elemptr;
  int ctr;
  SHIFT_TEMPS

  /* Zero 4 bottom rows of output coefficient block. */
  MEMZERO(&data[DCTSIZE*4], SIZEOF(DCTELEM) * DCTSIZE * 4);

  /* Pass 1: process rows. */
  /* Note results are scaled up by sqrt(8) compared to a true DCT; */
  /* furthermore, we scale the results by 2**PASS1_BITS. */
  /* We must also scale the output by 8/4 = 2, which we add here. */

  dataptr = data;
  for (ctr = 0; ctr < 4; ctr++) {
    elemptr = sample_data[ctr] + start_col;

    /* Even part per LL&M figure 1 --- note that published figure is faulty;
     * rotator "sqrt(2)*c1" should be "sqrt(2)*c6".
     */

    tmp0 = GETJSAMPLE(elemptr[0]) + GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) + GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) + GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) + GETJSAMPLE(elemptr[4]);

    tmp10 = tmp0 + tmp3;
    tmp12 = tmp0 - tmp3;
    tmp11 = tmp1 + tmp2;
    tmp13 = tmp1 - tmp2;

    tmp0 = GETJSAMPLE(elemptr[0]) - GETJSAMPLE(elemptr[7]);
    tmp1 = GETJSAMPLE(elemptr[1]) - GETJSAMPLE(elemptr[6]);
    tmp2 = GETJSAMPLE(elemptr[2]) - GETJSAMPLE(elemptr[5]);
    tmp3 = GETJSAMPLE(elemptr[3]) - GETJSAMPLE(elemptr[4]);

    /* Apply unsigned->signed conversion */
    dataptr[0] = (DCTELEM)
      ((tmp10 + tmp11 - 8 * CENTERJSAMPLE) << (PASS1_BITS+1));
    dataptr[4] = (DCTELEM) ((tmp10 - tmp11) << (PASS1_BITS+1));

    z1 = MULTIPLY(tmp12 + tmp13, FIX_0_541196100);
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-2);
    dataptr[2] = (DCTELEM) RIGHT_SHIFT(z1 + MULTIPLY(tmp12, FIX_0_765366865),
				       CONST_BITS-PASS1_BITS-1);
    dataptr[6] = (DCTELEM) RIGHT_SHIFT(z1 - MULTIPLY(tmp13, FIX_1_847759065),
				       CONST_BITS-PASS1_BITS-1);

    /* Odd part per figure 8 --- note paper omits factor of sqrt(2).
     * 8-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
     * i0..i3 in the paper are tmp0..tmp3 here.
     */

    tmp10 = tmp0 + tmp3;
    tmp11 = tmp1 + tmp2;
    tmp12 = tmp0 + tmp2;
    tmp13 = tmp1 + tmp3;
    z1 = MULTIPLY(tmp12 + tmp13, FIX_1_175875602); /*  c3 */
    /* Add fudge factor here for final descale. */
    z1 += ONE << (CONST_BITS-PASS1_BITS-2);

    tmp0  = MULTIPLY(tmp0,    FIX_1_501321110);    /*  c1+c3-c5-c7 */
    tmp1  = MULTIPLY(tmp1,    FIX_3_072711026);    /*  c1+c3+c5-c7 */
    tmp2  = MULTIPLY(tmp2,    FIX_2_053119869);    /*  c1+c3-c5+c7 */
    tmp3  = MULTIPLY(tmp3,    FIX_0_298631336);    /* -c1+c3+c5-c7 */
    tmp10 = MULTIPLY(tmp10, - FIX_0_899976223);    /*  c7-c3 */
    tmp11 = MULTIPLY(tmp11, - FIX_2_562915447);    /* -c1-c3 */
    tmp12 = MULTIPLY(tmp12, - FIX_0_390180644);    /*  c5-c3 */
    tmp13 = MULTIPLY(tmp13, - FIX_1_961570560);    /* -c3-c5 */

    tmp12 += z1;
    tmp13 += z1;

    dataptr[1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + tmp10 + tmp12, CONST_BITS-PASS1_BITS-1);
    dataptr[3] = (DCTELEM)
      RIGHT_SHIFT(tmp1 + tmp11 + tmp13, CONST_BITS-PASS1_BITS-1);
    dataptr[5] = (DCTELEM)
      RIGHT_SHIFT(tmp2 + tmp11 + tmp12, CONST_BITS-PASS1_BITS-1);
    dataptr[7] = (DCTELEM)
      RIGHT_SHIFT(tmp3 + tmp10 + tmp13, CONST_BITS-PASS1_BITS-1);

    dataptr += DCTSIZE;		/* advance pointer to next row */
  }

  /* Pass 2: process columns.
   * We remove the PASS1_BITS scaling, but leave the results scaled up
   * by an overall factor of 8.
   * 4-point FDCT kernel, cK represents sqrt(2) * cos(K*pi/16).
   */

  dataptr = data;
  for (ctr = DCTSIZE-1; ctr >= 0; ctr--) {
    /* Even part */

    /* Add fudge factor here for final descale. */
    tmp0 = dataptr[DCTSIZE*0] + dataptr[DCTSIZE*3] + (ONE << (PASS1_BITS-1));
    tmp1 = dataptr[DCTSIZE*1] + dataptr[DCTSIZE*2];

    tmp10 = dataptr[DCTSIZE*0] - dataptr[DCTSIZE*3];
    tmp11 = dataptr[DCTSIZE*1] - dataptr[DCTSIZE*2];

    dataptr[DCTSIZE*0] = (DCTELEM) RIGHT_SHIFT(tmp0 + tmp1, PASS1_BITS);
    dataptr[DCTSIZE*2] = (DCTELEM) RIGHT_SHIFT(tmp0 - tmp1, PASS1_BITS);

    /* Odd part */

    tmp0 = MULTIPLY(tmp10 + tmp11, FIX_0_541196100);   /* c6 */
    /* Add fudge factor here for final descale. */
    tmp0 += ONE << (CONST_BITS+PASS1_BITS-1);

    dataptr[DCTSIZE*1] = (DCTELEM)
      RIGHT_SHIFT(tmp0 + MULTIPLY(tmp10, FIX_0_765366865), /* c2-c6 */
		  CONST_BITS+PASS1_BITS);
    dataptr[DCTSIZE*3] = (DCTELEM)
      RIGHT_SHIFT(tmp0 - MULTIPLY(tmp11, FIX_1_847759065), /* c2+c6 */
		  CONST_BITS+PASS1_BITS);

    dataptr++;			/* advance pointer to next column */
  }
}